

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tifuhash.cpp
# Opt level: O1

void tifuhash_64(void *key,int len,uint32_t seed,void *out)

{
  undefined1 auVar1 [16];
  long lVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double local_28;
  
  if (seed == 0) {
    dVar3 = 0.14285714285714285;
    local_28 = 3.0;
  }
  else {
    auVar1 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,seed);
    dVar3 = 1.0 / auVar1._0_8_ + auVar1._0_8_;
    local_28 = pow(dVar3,0.3333333333333333);
    dVar3 = pow(dVar3,0.14285714285714285);
  }
  if (0 < len) {
    lVar2 = 0;
    dVar6 = 1.0;
    do {
      dVar7 = ((double)*(byte *)((long)key + lVar2) + 1.0 + (double)lVar2) / dVar3;
      local_28 = 1.0 / (local_28 + dVar6 / dVar7);
      dVar3 = dVar6 / (dVar3 + (double)*(byte *)((long)key + lVar2));
      dVar6 = dVar7 + 1.0;
      lVar2 = lVar2 + 1;
    } while (len != lVar2);
  }
  local_28 = local_28 * (dVar3 + 3.141592653589793);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar3 * (local_28 + 2.718281828459045);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_28;
  auVar1 = vinsertps_avx(auVar5,auVar4,0x4c);
  auVar4 = vinsertps_avx(auVar5,auVar4,0x1c);
  auVar1 = vpaddd_avx(auVar1,auVar4);
  *(long *)out = auVar1._0_8_;
  return;
}

Assistant:

void tifuhash_64 ( const void * key, int len,
                   uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t *)key;
  uint8_t buf [16];
  double * state = (double*)buf;
  uint32_t * state32 = (uint32_t*)buf;
  double seed32 = (double)seed;

  setup( state, seed32 );
  round( data, len, state );

  uint32_t h[2];
  
  h[0] = state32[0] + state32[3];
  h[1] = state32[1] + state32[2];

  ((uint32_t*)out)[0] = h[0];
  ((uint32_t*)out)[1] = h[1];
}